

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void WindowSettingsHandler_WriteAll
               (ImGuiContext *ctx,ImGuiSettingsHandler *handler,ImGuiTextBuffer *buf)

{
  undefined8 uVar1;
  ImGuiContext *this;
  int iVar2;
  int iVar3;
  ImGuiWindow **ppIVar4;
  char *pcVar5;
  ImGuiWindowSettings *local_60;
  char *settings_name;
  ImGuiWindowSettings *settings_1;
  ImGuiWindowSettings *local_40;
  ImGuiWindowSettings *settings;
  ImGuiWindow *window;
  ImGuiContext *pIStack_28;
  int i;
  ImGuiContext *g;
  ImGuiTextBuffer *buf_local;
  ImGuiSettingsHandler *handler_local;
  ImGuiContext *ctx_local;
  
  window._4_4_ = 0;
  pIStack_28 = ctx;
  g = (ImGuiContext *)buf;
  buf_local = (ImGuiTextBuffer *)handler;
  handler_local = (ImGuiSettingsHandler *)ctx;
  do {
    this = g;
    if (window._4_4_ == (pIStack_28->Windows).Size) {
      iVar2 = ImGuiTextBuffer::size((ImGuiTextBuffer *)g);
      iVar3 = ImChunkStream<ImGuiWindowSettings>::size(&pIStack_28->SettingsWindows);
      ImGuiTextBuffer::reserve((ImGuiTextBuffer *)this,iVar2 + iVar3 * 6);
      for (settings_name =
                (char *)ImChunkStream<ImGuiWindowSettings>::begin(&pIStack_28->SettingsWindows);
          settings_name != (char *)0x0;
          settings_name =
               (char *)ImChunkStream<ImGuiWindowSettings>::next_chunk
                                 (&pIStack_28->SettingsWindows,(ImGuiWindowSettings *)settings_name)
          ) {
        pcVar5 = ImGuiWindowSettings::GetName((ImGuiWindowSettings *)settings_name);
        uVar1._0_4_ = (buf_local->Buf).Size;
        uVar1._4_4_ = (buf_local->Buf).Capacity;
        ImGuiTextBuffer::appendf((ImGuiTextBuffer *)g,"[%s][%s]\n",uVar1,pcVar5);
        ImGuiTextBuffer::appendf
                  ((ImGuiTextBuffer *)g,"Pos=%d,%d\n",
                   (ulong)(uint)(int)*(short *)(settings_name + 4),
                   (ulong)(uint)(int)*(short *)(settings_name + 6));
        ImGuiTextBuffer::appendf
                  ((ImGuiTextBuffer *)g,"Size=%d,%d\n",
                   (ulong)(uint)(int)*(short *)(settings_name + 8),
                   (ulong)(uint)(int)*(short *)(settings_name + 10));
        ImGuiTextBuffer::appendf
                  ((ImGuiTextBuffer *)g,"Collapsed=%d\n",(ulong)(settings_name[0xc] & 1));
        ImGuiTextBuffer::append((ImGuiTextBuffer *)g,"\n",(char *)0x0);
      }
      return;
    }
    ppIVar4 = ImVector<ImGuiWindow_*>::operator[](&pIStack_28->Windows,window._4_4_);
    settings = (ImGuiWindowSettings *)*ppIVar4;
    if ((((ImGuiWindow *)settings)->Flags & 0x100U) == 0) {
      if (((ImGuiWindow *)settings)->SettingsOffset == -1) {
        local_60 = ImGui::FindWindowSettings(((ImGuiWindow *)settings)->ID);
      }
      else {
        local_60 = ImChunkStream<ImGuiWindowSettings>::ptr_from_offset
                             (&pIStack_28->SettingsWindows,((ImGuiWindow *)settings)->SettingsOffset
                             );
      }
      local_40 = local_60;
      if (local_60 == (ImGuiWindowSettings *)0x0) {
        local_40 = ImGui::CreateNewWindowSettings(*(char **)settings);
        iVar2 = ImChunkStream<ImGuiWindowSettings>::offset_from_ptr
                          (&pIStack_28->SettingsWindows,local_40);
        settings[0x2a].Collapsed = (bool)(char)iVar2;
        settings[0x2a].WantApply = (bool)(char)((uint)iVar2 >> 8);
        *(short *)&settings[0x2a].field_0xe = (short)((uint)iVar2 >> 0x10);
      }
      if ((ImVec2ih)local_40->ID != settings->Size) {
        __assert_fail("settings->ID == window->ID",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/imgui/imgui.cpp"
                      ,0x26d1,
                      "void WindowSettingsHandler_WriteAll(ImGuiContext *, ImGuiSettingsHandler *, ImGuiTextBuffer *)"
                     );
      }
      ImVec2ih::ImVec2ih((ImVec2ih *)((long)&settings_1 + 4),(short)(int)(float)settings[1].ID,
                         (short)(int)(float)settings[1].Pos);
      local_40->Pos = settings_1._4_4_;
      ImVec2ih::ImVec2ih((ImVec2ih *)&settings_1,(short)(int)(float)settings[2].ID,
                         (short)(int)(float)settings[2].Pos);
      local_40->Size = settings_1._0_4_;
      local_40->Collapsed = (bool)(*(byte *)((long)&settings[8].ID + 1) & 1);
    }
    window._4_4_ = window._4_4_ + 1;
  } while( true );
}

Assistant:

static void WindowSettingsHandler_WriteAll(ImGuiContext* ctx, ImGuiSettingsHandler* handler, ImGuiTextBuffer* buf)
{
    // Gather data from windows that were active during this session
    // (if a window wasn't opened in this session we preserve its settings)
    ImGuiContext& g = *ctx;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Flags & ImGuiWindowFlags_NoSavedSettings)
            continue;

        ImGuiWindowSettings* settings = (window->SettingsOffset != -1) ? g.SettingsWindows.ptr_from_offset(window->SettingsOffset) : ImGui::FindWindowSettings(window->ID);
        if (!settings)
        {
            settings = ImGui::CreateNewWindowSettings(window->Name);
            window->SettingsOffset = g.SettingsWindows.offset_from_ptr(settings);
        }
        IM_ASSERT(settings->ID == window->ID);
        settings->Pos = ImVec2ih((short)window->Pos.x, (short)window->Pos.y);
        settings->Size = ImVec2ih((short)window->SizeFull.x, (short)window->SizeFull.y);
        settings->Collapsed = window->Collapsed;
    }

    // Write to text buffer
    buf->reserve(buf->size() + g.SettingsWindows.size() * 6); // ballpark reserve
    for (ImGuiWindowSettings* settings = g.SettingsWindows.begin(); settings != NULL; settings = g.SettingsWindows.next_chunk(settings))
    {
        const char* settings_name = settings->GetName();
        buf->appendf("[%s][%s]\n", handler->TypeName, settings_name);
        buf->appendf("Pos=%d,%d\n", settings->Pos.x, settings->Pos.y);
        buf->appendf("Size=%d,%d\n", settings->Size.x, settings->Size.y);
        buf->appendf("Collapsed=%d\n", settings->Collapsed);
        buf->append("\n");
    }
}